

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

int lj_bcwrite(lua_State *L,GCproto *pt,lua_Writer writer,void *data,int strip)

{
  undefined8 *puVar1;
  int iVar2;
  ulong uVar3;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  lua_State *local_30;
  GCproto *local_28;
  lua_Writer local_20;
  void *local_18;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_30 = L;
  local_28 = pt;
  local_20 = writer;
  local_18 = data;
  local_10 = strip;
  iVar2 = lj_vm_cpcall(L,0,&local_48,cpwriter);
  if (iVar2 == 0) {
    iVar2 = local_c;
  }
  puVar1 = *(undefined8 **)(((ulong)local_30 & 0xfffffffffffffff8) + 0x10);
  uVar3 = (ulong)(uint)((int)uStack_40 - (int)local_38);
  puVar1[2] = puVar1[2] - uVar3;
  (*(code *)*puVar1)(puVar1[1],local_38,uVar3,0);
  return iVar2;
}

Assistant:

int lj_bcwrite(lua_State *L, GCproto *pt, lua_Writer writer, void *data,
	      int strip)
{
  BCWriteCtx ctx;
  int status;
  ctx.pt = pt;
  ctx.wfunc = writer;
  ctx.wdata = data;
  ctx.strip = strip;
  ctx.status = 0;
#ifdef LUA_USE_ASSERT
  ctx.g = G(L);
#endif
  lj_buf_init(L, &ctx.sb);
  status = lj_vm_cpcall(L, NULL, &ctx, cpwriter);
  if (status == 0) status = ctx.status;
  lj_buf_free(G(sbufL(&ctx.sb)), &ctx.sb);
  return status;
}